

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O2

void double_suite::test_scatter(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  double *in_stack_ffffffffffffff18;
  double local_e0;
  value_type local_d8;
  regression<double,_4UL> filter;
  
  memset(&filter,0,0xa0);
  trial::online::interim::regression<double,_4UL>::push(&filter,1.0,1.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x17e,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,predicate
            );
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 1.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x17f,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_00);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,1.0);
  local_e0 = 1.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(1.0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x180,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_01);
  trial::online::interim::regression<double,_4UL>::push(&filter,2.0,2.0);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 1.0;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x183,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_02);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.0;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x184,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_03);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,2.0);
  local_e0 = 2.0;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(2.0)","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x185,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_04);
  trial::online::interim::regression<double,_4UL>::push(&filter,3.0,1.3);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.15;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x188,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_05);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 1.13333;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","1.13333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x189,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_06);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,3.0);
  local_e0 = 1.58333;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(3.0)","1.58333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18a,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_07);
  trial::online::interim::regression<double,_4UL>::push(&filter,4.0,3.75);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.755;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.755","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18d,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_08);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = 0.125;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","0.125","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18e,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_09);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,4.0);
  local_e0 = 3.145;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(4.0)","3.145","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18f,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_10);
  trial::online::interim::regression<double,_4UL>::push(&filter,5.0,2.25);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.755;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.755","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x194,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_11);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = -0.535;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","-0.535","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x195,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_12);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,5.0);
  local_e0 = 3.24;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(5.0)","3.24","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x196,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_13);
  trial::online::interim::regression<double,_4UL>::push(&filter,6.0,4.5);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.818617;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.818617","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x199,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_14);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = -0.762943;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","-0.762943","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19a,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_15);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,6.0);
  local_e0 = 4.14876;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(6.0)","4.14876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19b,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_16);
  trial::online::interim::regression<double,_4UL>::push(&filter,7.0,4.5);
  local_d8 = trial::online::interim::regression<double,_4UL>::slope(&filter);
  local_e0 = 0.883696;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.883696","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19e,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_17);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,0.0);
  local_e0 = -1.35854;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","-1.35854","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19f,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_18);
  local_d8 = trial::online::interim::regression<double,_4UL>::at(&filter,7.0);
  local_e0 = 4.82733;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(7.0)","4.82733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x1a0,0x1086fd,(char *)&local_d8,&local_e0,in_stack_ffffffffffffff18,
             predicate_19);
  return;
}

Assistant:

void test_linear_increase_slope_2()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    interim::regression<double, 4> filter;

    filter.push(0.0, 0.0);
    TRIAL_TEST_WITH(filter.slope(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1.0, 2.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(1.0), 2.0, tolerance);

    filter.push(2.0, 4.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(2.0), 4.0, tolerance);

    filter.push(3.0, 6.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(3.0), 6.0, tolerance);

    // Window full

    filter.push(4.0, 8.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(4.0), 8.0, tolerance);

    filter.push(5.0, 10.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(5.0), 10.0, tolerance);

    filter.push(6.0, 12.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(6.0), 12.0, tolerance);

    filter.push(7.0, 14.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(7.0), 14.0, tolerance);

    filter.push(8.0, 16.0);
    TRIAL_TEST_WITH(filter.slope(), 2.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(8.0), 16.0, tolerance);
}